

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O3

Assignment * __thiscall
soul::PoolAllocator::
allocate<soul::AST::Assignment,soul::AST::Context&,soul::pool_ref<soul::AST::Expression>&,soul::AST::BinaryOperator&>
          (PoolAllocator *this,Context *args,pool_ref<soul::AST::Expression> *args_1,
          BinaryOperator *args_2)

{
  Expression *pEVar1;
  SourceCodeText *pSVar2;
  Scope *pSVar3;
  PoolItem *pPVar4;
  
  pPVar4 = allocateSpaceForObject(this,0x40);
  pEVar1 = args_1->object;
  *(undefined4 *)&pPVar4->field_0x18 = 0x15;
  pSVar2 = (args->location).sourceCode.object;
  pPVar4[1].size = (size_t)pSVar2;
  if (pSVar2 != (SourceCodeText *)0x0) {
    (pSVar2->super_RefCountedObject).refCount = (pSVar2->super_RefCountedObject).refCount + 1;
  }
  pSVar3 = args->parentScope;
  pPVar4[1].destructor = (DestructorFn *)(args->location).location.data;
  pPVar4[1].item = pSVar3;
  *(undefined4 *)&pPVar4[1].field_0x18 = 0;
  pPVar4->item = &PTR__Assignment_002f6b70;
  pPVar4[2].size = (size_t)pEVar1;
  pPVar4[2].destructor = (DestructorFn *)args_2;
  pPVar4->destructor =
       allocate<soul::AST::Assignment,_soul::AST::Context_&,_soul::pool_ref<soul::AST::Expression>_&,_soul::AST::BinaryOperator_&>
       ::anon_class_1_0_00000001::__invoke;
  return (Assignment *)&pPVar4->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }